

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall higan::TcpServer::Start(TcpServer *this)

{
  LogLevel LVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  string local_348;
  Fmt local_328;
  Logger local_228;
  TcpServer *local_10;
  TcpServer *this_local;
  
  local_10 = this;
  EventLoopThreadPool::Start(&this->thread_pool_);
  LVar1 = Logger::GetLogLevel();
  if ((int)LVar1 < 2) {
    Logger::Logger(&local_228,INFO,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/TcpServer.cpp"
                   ,0x1f,"Start");
    uVar2 = std::__cxx11::string::c_str();
    InetAddress::GetIpPort_abi_cxx11_(&local_348,&this->server_addr_);
    uVar3 = std::__cxx11::string::c_str();
    Fmt::Fmt(&local_328,"server: %s, listen on %s",uVar2,uVar3);
    Logger::operator<<(&local_228,&local_328);
    std::__cxx11::string::~string((string *)&local_348);
    Logger::~Logger(&local_228);
  }
  Acceptor::Listen(&this->acceptor_);
  return;
}

Assistant:

void TcpServer::Start()
{
	thread_pool_.Start();

	LOG_INFO << higan::Fmt("server: %s, listen on %s", server_name_.c_str(), server_addr_.GetIpPort().c_str());
	acceptor_.Listen();
}